

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state_tests.cc
# Opt level: O3

int __thiscall hwtest::pgraph::StateTest::run_once(StateTest *this)

{
  pgraph_state *state;
  pgraph_state *state_00;
  int iVar1;
  int iVar2;
  
  this->skip = false;
  state = &this->orig;
  pgraph_gen_state((this->super_RepeatTest).super_Test.cnum,&(this->super_RepeatTest).super_Test.rnd
                   ,state);
  (*(this->super_RepeatTest).super_Test._vptr_Test[9])(this);
  pgraph_load_state((this->super_RepeatTest).super_Test.cnum,state);
  state_00 = &this->exp;
  memcpy(state_00,state,0xc1a0);
  (*(this->super_RepeatTest).super_Test._vptr_Test[10])(this);
  pgraph_calc_state(state_00);
  (this->real).celsius_pipe_broke_ovtx = (this->orig).celsius_pipe_broke_ovtx;
  pgraph_dump_state((this->super_RepeatTest).super_Test.cnum,&this->real);
  iVar1 = (*(this->super_RepeatTest).super_Test._vptr_Test[0xb])(this);
  iVar2 = 0;
  if (this->skip == false) {
    iVar1 = pgraph_cmp_state(state,state_00,&this->real,SUB41(iVar1,0));
    if (iVar1 == 0) {
      iVar2 = 1;
    }
    else {
      (*(this->super_RepeatTest).super_Test._vptr_Test[0xc])(this);
      iVar2 = 3;
    }
  }
  return iVar2;
}

Assistant:

int StateTest::run_once() {
	skip = false;
	pgraph_gen_state(cnum, rnd, &orig);
	adjust_orig();
	pgraph_load_state(cnum, &orig);
	exp = orig;
	mutate();
	pgraph_calc_state(&exp);
	real.celsius_pipe_broke_ovtx = orig.celsius_pipe_broke_ovtx;
	pgraph_dump_state(cnum, &real);
	bool fail = other_fail();
	if (skip)
		return HWTEST_RES_NA;
	if (pgraph_cmp_state(&orig, &exp, &real, fail)) {
		print_fail();
		return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}